

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

UBool icu_63::enumAlgNames
                (AlgorithmicRange *range,UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,
                void *context,UCharNameChoice nameChoice)

{
  byte bVar1;
  short sVar2;
  bool bVar3;
  UBool UVar4;
  char cVar5;
  uint16_t uVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  uint uVar17;
  ushort local_1b0;
  uint16_t indexes [8];
  char *elements [8];
  char buffer [200];
  char *elementBases [8];
  
  if ((nameChoice & ~U_EXTENDED_CHAR_NAME) != U_UNICODE_CHAR_NAME) {
    return '\x01';
  }
  if (range->type == '\x01') {
    bVar1 = range->variant;
    uVar9 = (ulong)bVar1;
    pcVar13 = (char *)((long)&range[1].start + uVar9 * 2 + 1);
    cVar5 = *(char *)((long)&range[1].start + uVar9 * 2);
    if (cVar5 == '\0') {
      pcVar12 = buffer;
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      do {
        uVar10 = uVar16;
        buffer[uVar10] = cVar5;
        cVar5 = pcVar13[uVar10];
        uVar16 = uVar10 + 1;
      } while (cVar5 != '\0');
      pcVar13 = pcVar13 + uVar16;
      pcVar12 = buffer + uVar10 + 1;
    }
    local_1b0 = (ushort)bVar1;
    uVar6 = writeFactorSuffix((uint16_t *)(range + 1),local_1b0,pcVar13,start - range->start,indexes
                              ,elementBases,elements,pcVar12,200 - (ushort)uVar16);
    UVar4 = (*fn)(context,start,nameChoice,buffer,(int)uVar16 + (uint)uVar6 & 0xffff);
    if (UVar4 != '\0') {
      uVar17 = local_1b0 - 1 & 0xffff;
      do {
        start = start + 1;
        if (limit <= start) goto LAB_003124a7;
        uVar10 = (ulong)(uVar17 * 2);
        sVar2 = *(short *)((long)indexes + uVar10);
        uVar11 = local_1b0 - 2;
        uVar8 = uVar17;
        while( true ) {
          if ((ushort)(sVar2 + 1U) < *(ushort *)((long)&range[1].start + uVar10)) break;
          indexes[uVar8] = 0;
          elements[uVar8] = elementBases[uVar8];
          uVar8 = uVar11 & 0xffff;
          uVar10 = (ulong)(uVar8 * 2);
          sVar2 = *(short *)((long)indexes + uVar10);
          uVar11 = uVar11 - 1;
        }
        indexes[uVar8] = sVar2 + 1U;
        pcVar13 = elements[uVar8];
        do {
          cVar5 = *pcVar13;
          pcVar13 = pcVar13 + 1;
        } while (cVar5 != '\0');
        elements[uVar8] = pcVar13;
        pcVar13 = pcVar12;
        uVar7 = (ushort)uVar16;
        if (bVar1 != 0) {
          uVar14 = 0;
          uVar10 = uVar16 & 0xffffffff;
          do {
            pcVar15 = elements[uVar14];
            cVar5 = *pcVar15;
            while (cVar5 != '\0') {
              pcVar15 = pcVar15 + 1;
              *pcVar13 = cVar5;
              pcVar13 = pcVar13 + 1;
              uVar10 = (ulong)((int)uVar10 + 1);
              cVar5 = *pcVar15;
            }
            uVar7 = (ushort)uVar10;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar9);
        }
        *pcVar13 = '\0';
        UVar4 = (*fn)(context,start,nameChoice,buffer,(uint)uVar7);
      } while (UVar4 != '\0');
    }
    UVar4 = '\0';
  }
  else {
    if (range->type == '\0') {
      uVar6 = getAlgName(range,start,nameChoice,buffer,200);
      if (uVar6 == 0) {
        UVar4 = '\x01';
        bVar3 = false;
      }
      else {
        UVar4 = (*fn)(context,start,nameChoice,buffer,(uint)uVar6);
        if (UVar4 == '\0') {
          bVar3 = false;
        }
        else {
          pcVar13 = (char *)((long)elements + 0x3e);
          do {
            pcVar12 = pcVar13 + 2;
            pcVar13 = pcVar13 + 1;
          } while (*pcVar12 != '\0');
          do {
            start = start + 1;
            bVar3 = limit <= start;
            if (limit <= start) break;
            cVar5 = *pcVar13;
            pcVar12 = pcVar13;
            if (4 < (byte)(cVar5 + 0xbfU) && 8 < (byte)(cVar5 - 0x30U)) {
              do {
                if (cVar5 == 'F') {
                  *pcVar12 = '0';
                }
                else if (cVar5 == '9') {
                  cVar5 = 'A';
                  goto LAB_003122b1;
                }
                cVar5 = pcVar12[-1];
                pcVar12 = pcVar12 + -1;
              } while ((8 < (byte)(cVar5 - 0x30U)) && (4 < (byte)(cVar5 + 0xbfU)));
            }
            cVar5 = cVar5 + '\x01';
LAB_003122b1:
            *pcVar12 = cVar5;
            UVar4 = (*fn)(context,start,nameChoice,buffer,(uint)uVar6);
          } while (UVar4 != '\0');
        }
        UVar4 = '\0';
      }
      if (!bVar3) {
        return UVar4;
      }
    }
LAB_003124a7:
    UVar4 = '\x01';
  }
  return UVar4;
}

Assistant:

static UBool
enumAlgNames(AlgorithmicRange *range,
             UChar32 start, UChar32 limit,
             UEnumCharNamesFn *fn, void *context,
             UCharNameChoice nameChoice) {
    char buffer[200];
    uint16_t length;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        return TRUE;
    }

    switch(range->type) {
    case 0: {
        char *s, *end;
        char c;

        /* get the full name of the start character */
        length=getAlgName(range, (uint32_t)start, nameChoice, buffer, sizeof(buffer));
        if(length<=0) {
            return TRUE;
        }

        /* call the enumerator function with this first character */
        if(!fn(context, start, nameChoice, buffer, length)) {
            return FALSE;
        }

        /* go to the end of the name; all these names have the same length */
        end=buffer;
        while(*end!=0) {
            ++end;
        }

        /* enumerate the rest of the names */
        while(++start<limit) {
            /* increment the hexadecimal number on a character-basis */
            s=end;
            for (;;) {
                c=*--s;
                if(('0'<=c && c<'9') || ('A'<=c && c<'F')) {
                    *s=(char)(c+1);
                    break;
                } else if(c=='9') {
                    *s='A';
                    break;
                } else if(c=='F') {
                    *s='0';
                }
            }

            if(!fn(context, start, nameChoice, buffer, length)) {
                return FALSE;
            }
        }
        break;
    }
    case 1: {
        uint16_t indexes[8];
        const char *elementBases[8], *elements[8];
        const uint16_t *factors=(const uint16_t *)(range+1);
        uint16_t count=range->variant;
        const char *s=(const char *)(factors+count);
        char *suffix, *t;
        uint16_t prefixLength, i, idx;

        char c;

        /* name = prefix factorized-elements */

        /* copy prefix */
        suffix=buffer;
        prefixLength=0;
        while((c=*s++)!=0) {
            *suffix++=c;
            ++prefixLength;
        }

        /* append the suffix of the start character */
        length=(uint16_t)(prefixLength+writeFactorSuffix(factors, count,
                                              s, (uint32_t)start-range->start,
                                              indexes, elementBases, elements,
                                              suffix, (uint16_t)(sizeof(buffer)-prefixLength)));

        /* call the enumerator function with this first character */
        if(!fn(context, start, nameChoice, buffer, length)) {
            return FALSE;
        }

        /* enumerate the rest of the names */
        while(++start<limit) {
            /* increment the indexes in lexical order bound by the factors */
            i=count;
            for (;;) {
                idx=(uint16_t)(indexes[--i]+1);
                if(idx<factors[i]) {
                    /* skip one index and its element string */
                    indexes[i]=idx;
                    s=elements[i];
                    while(*s++!=0) {
                    }
                    elements[i]=s;
                    break;
                } else {
                    /* reset this index to 0 and its element string to the first one */
                    indexes[i]=0;
                    elements[i]=elementBases[i];
                }
            }

            /* to make matters a little easier, just append all elements to the suffix */
            t=suffix;
            length=prefixLength;
            for(i=0; i<count; ++i) {
                s=elements[i];
                while((c=*s++)!=0) {
                    *t++=c;
                    ++length;
                }
            }
            /* zero-terminate */
            *t=0;

            if(!fn(context, start, nameChoice, buffer, length)) {
                return FALSE;
            }
        }
        break;
    }
    default:
        /* undefined type */
        break;
    }

    return TRUE;
}